

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

bool Imf_3_2::anon_unknown_0::readMultiPart
               (MultiPartInputFile *in,bool reduceMemory,bool reduceTime)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  Header *pHVar4;
  Compression *pCVar5;
  string *psVar6;
  ulong uVar7;
  byte in_DL;
  byte in_SIL;
  MultiPartInputFile *in_RDI;
  DeepTiledInputPart pt_3;
  bool gotThrow_3;
  DeepScanLineInputPart pt_2;
  bool gotThrow_2;
  TiledInputPart pt_1;
  bool gotThrow_1;
  InputPart pt;
  bool gotThrow;
  uint64_t tileSize;
  uint64_t tilesPerScanline;
  TileDescription *tileDescription;
  uint64_t scanlinesInBuffer;
  uint64_t imageWidth;
  int bytesPerPixel;
  Box2i b;
  bool largeTiles;
  bool widePart;
  int part;
  bool threw;
  undefined1 in_stack_00000246;
  undefined1 in_stack_00000247;
  TiledInputPart *in_stack_00000248;
  undefined1 in_stack_00000276;
  undefined1 in_stack_00000277;
  InputPart *in_stack_00000278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff61;
  undefined1 in_stack_ffffffffffffff62;
  undefined1 in_stack_ffffffffffffff63;
  int iVar8;
  Header *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  TiledInputPart local_78 [11];
  undefined1 local_6d;
  InputPart local_60 [15];
  undefined1 local_51;
  long local_50;
  ulong local_48;
  uint *local_40;
  long local_38;
  long local_30;
  int local_28;
  int local_24;
  int local_1c;
  byte local_12;
  byte local_11;
  int local_10;
  byte local_b;
  byte local_a;
  byte local_9;
  MultiPartInputFile *local_8;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_b = 0;
  local_10 = 0;
  local_8 = in_RDI;
  while (iVar8 = local_10, iVar3 = Imf_3_2::MultiPartInputFile::parts(), iVar8 < iVar3) {
    Imf_3_2::MultiPartInputFile::header((int)local_8);
    bVar1 = enumsValid(in_stack_ffffffffffffff68);
    if (!bVar1) {
      local_b = 1;
    }
    local_11 = 0;
    local_12 = 0;
    Imf_3_2::MultiPartInputFile::header((int)local_8);
    Imf_3_2::Header::dataWindow();
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
              ((Box<Imath_3_2::Vec2<int>_> *)
               CONCAT44(iVar8,CONCAT13(in_stack_ffffffffffffff63,
                                       CONCAT12(in_stack_ffffffffffffff62,
                                                CONCAT11(in_stack_ffffffffffffff61,
                                                         in_stack_ffffffffffffff60)))),
               (Box<Imath_3_2::Vec2<int>_> *)in_stack_ffffffffffffff58);
    pHVar4 = (Header *)Imf_3_2::MultiPartInputFile::header((int)local_8);
    local_28 = Imf_3_2::calculateBytesPerPixel(pHVar4);
    local_30 = ((long)local_1c - (long)local_24) + 1;
    Imf_3_2::MultiPartInputFile::header((int)local_8);
    pCVar5 = (Compression *)Imf_3_2::Header::compression();
    iVar3 = Imf_3_2::numLinesInBuffer(*pCVar5);
    local_38 = (long)iVar3;
    if (8000000 < (ulong)(local_30 * local_28 * local_38)) {
      local_11 = 1;
    }
    Imf_3_2::MultiPartInputFile::header((int)local_8);
    psVar6 = (string *)Imf_3_2::Header::type_abi_cxx11_();
    uVar7 = Imf_3_2::isTiled(psVar6);
    if ((uVar7 & 1) != 0) {
      Imf_3_2::MultiPartInputFile::header((int)local_8);
      local_40 = (uint *)Imf_3_2::Header::tileDescription();
      local_48 = ((local_30 + (ulong)*local_40) - 1) / (ulong)*local_40;
      local_50 = (ulong)*local_40 * (ulong)local_40[1];
      if (8000000 < local_50 * local_48 * (long)local_28) {
        local_11 = 1;
      }
      if (1000000 < (ulong)(local_50 * local_28)) {
        local_12 = 1;
      }
    }
    if (((local_9 & 1) == 0) || ((local_11 & 1) == 0)) {
      local_51 = 0;
      Imf_3_2::InputPart::InputPart(local_60,local_8,local_10);
      in_stack_ffffffffffffff63 =
           readScanline<Imf_3_2::InputPart>
                     (in_stack_00000278,(bool)in_stack_00000277,(bool)in_stack_00000276);
      local_51 = in_stack_ffffffffffffff63;
      if ((bool)in_stack_ffffffffffffff63) {
        Imf_3_2::MultiPartInputFile::header((int)local_8);
        Imf_3_2::Header::type_abi_cxx11_();
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(iVar8,CONCAT13(in_stack_ffffffffffffff63,
                                                         CONCAT12(in_stack_ffffffffffffff62,
                                                                  CONCAT11(in_stack_ffffffffffffff61
                                                                           ,
                                                  in_stack_ffffffffffffff60)))),
                                in_stack_ffffffffffffff58);
        if (bVar1) {
          local_b = 1;
        }
      }
    }
    if (((local_9 & 1) == 0) || ((local_12 & 1) == 0)) {
      local_6d = 0;
      Imf_3_2::MultiPartInputFile::flushPartCache();
      Imf_3_2::TiledInputPart::TiledInputPart(local_78,local_8,local_10);
      in_stack_ffffffffffffff62 =
           readTile<Imf_3_2::TiledInputPart>
                     (in_stack_00000248,(bool)in_stack_00000247,(bool)in_stack_00000246);
      local_6d = in_stack_ffffffffffffff62;
      if ((bool)in_stack_ffffffffffffff62) {
        Imf_3_2::MultiPartInputFile::header((int)local_8);
        Imf_3_2::Header::type_abi_cxx11_();
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                                in_stack_ffffffffffffff78);
        if (_Var2) {
          local_b = 1;
        }
      }
    }
    if (((local_9 & 1) == 0) || ((local_11 & 1) == 0)) {
      Imf_3_2::MultiPartInputFile::flushPartCache();
      Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
                ((DeepScanLineInputPart *)&stack0xffffffffffffff78,local_8,local_10);
      in_stack_ffffffffffffff61 =
           readDeepScanLine<Imf_3_2::DeepScanLineInputPart>
                     ((DeepScanLineInputPart *)in_stack_00000248,(bool)in_stack_00000247,
                      (bool)in_stack_00000246);
      in_stack_ffffffffffffff87 = in_stack_ffffffffffffff61;
      if ((bool)in_stack_ffffffffffffff61) {
        Imf_3_2::MultiPartInputFile::header((int)local_8);
        Imf_3_2::Header::type_abi_cxx11_();
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                                in_stack_ffffffffffffff78);
        if (_Var2) {
          local_b = 1;
        }
      }
    }
    if (((local_9 & 1) == 0) || ((local_12 & 1) == 0)) {
      Imf_3_2::MultiPartInputFile::flushPartCache();
      Imf_3_2::DeepTiledInputPart::DeepTiledInputPart
                ((DeepTiledInputPart *)&stack0xffffffffffffff68,local_8,local_10);
      in_stack_ffffffffffffff60 =
           readDeepTile<Imf_3_2::DeepTiledInputPart>
                     ((DeepTiledInputPart *)in_stack_00000278,(bool)in_stack_00000277,
                      (bool)in_stack_00000276);
      if ((bool)in_stack_ffffffffffffff60) {
        Imf_3_2::MultiPartInputFile::header((int)local_8);
        Imf_3_2::Header::type_abi_cxx11_();
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                                in_stack_ffffffffffffff78);
        if (_Var2) {
          local_b = 1;
        }
      }
    }
    local_10 = local_10 + 1;
  }
  return (bool)(local_b & 1);
}

Assistant:

bool
readMultiPart (MultiPartInputFile& in, bool reduceMemory, bool reduceTime)
{
    bool threw = false;
    for (int part = 0; part < in.parts (); ++part)
    {

        if (!enumsValid (in.header (part))) { threw = true; }

        bool     widePart      = false;
        bool     largeTiles    = false;
        Box2i    b             = in.header (part).dataWindow ();
        int      bytesPerPixel = calculateBytesPerPixel (in.header (part));
        uint64_t imageWidth    = static_cast<uint64_t> (b.max.x) -
                              static_cast<uint64_t> (b.min.x) + 1ll;
        uint64_t scanlinesInBuffer =
            numLinesInBuffer (in.header (part).compression ());

        //
        // very wide scanline parts take excessive memory to read.
        // compute memory required to store a group of scanlines
        // so tests can be skipped when reduceMemory is set
        //

        if (imageWidth * bytesPerPixel * scanlinesInBuffer >
            gMaxBytesPerScanline)
        {
            widePart = true;
        }
        //
        // significant memory is also required to read a tiled part
        // using the scanline interface with tall tiles - the scanlineAPI
        // needs to allocate memory to store an entire row of tiles
        //
        if (isTiled (in.header (part).type ()))
        {
            const TileDescription& tileDescription =
                in.header (part).tileDescription ();

            uint64_t tilesPerScanline =
                (imageWidth + tileDescription.xSize - 1ll) /
                tileDescription.xSize;
            uint64_t tileSize = static_cast<uint64_t> (tileDescription.xSize) *
                                static_cast<uint64_t> (tileDescription.ySize);

            if (tileSize * tilesPerScanline * bytesPerPixel >
                gMaxTileBytesPerScanline)
            {
                widePart = true;
            }
            if (tileSize * bytesPerPixel > gMaxTileBytes) { largeTiles = true; }
        }

        if (!reduceMemory || !widePart)
        {
            bool gotThrow = false;
            try
            {
                InputPart pt (in, part);
                gotThrow = readScanline (pt, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }
            // only 'DeepTiled' parts are expected to throw
            // all others are an error
            if (gotThrow && in.header (part).type () != DEEPTILE)
            {
                threw = true;
            }
        }

        if (!reduceMemory || !largeTiles)
        {
            bool gotThrow = false;

            try
            {
                in.flushPartCache ();
                TiledInputPart pt (in, part);
                gotThrow = readTile (pt, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }

            if (gotThrow && in.header (part).type () == TILEDIMAGE)
            {
                threw = true;
            }
        }

        if (!reduceMemory || !widePart)
        {
            bool gotThrow = false;

            try
            {
                in.flushPartCache ();
                DeepScanLineInputPart pt (in, part);
                gotThrow = readDeepScanLine (pt, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }

            if (gotThrow && in.header (part).type () == DEEPSCANLINE)
            {
                threw = true;
            }
        }

        if (!reduceMemory || !largeTiles)
        {
            bool gotThrow = false;

            try
            {
                in.flushPartCache ();
                DeepTiledInputPart pt (in, part);
                gotThrow = readDeepTile (pt, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }

            if (gotThrow && in.header (part).type () == DEEPTILE)
            {
                threw = true;
            }
        }
    }

    return threw;
}